

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout.c
# Opt level: O2

int writeTime(FILE *stream,writeoutvar *wovar,per_transfer *per,CURLcode per_result,_Bool use_json)

{
  int iVar1;
  long lVar2;
  undefined4 in_register_0000000c;
  curl_off_t us;
  
  us = 0;
  if ((wovar->ci != CURLINFO_NONE) &&
     (iVar1 = curl_easy_getinfo(per->curl,wovar->ci,&us,CONCAT44(in_register_0000000c,per_result)),
     iVar1 == 0)) {
    lVar2 = us / 1000000;
    us = us % 1000000;
    if (use_json) {
      curl_mfprintf(stream,"\"%s\":",wovar->name,us);
    }
    curl_mfprintf(stream,"%lu.%06lu",lVar2,us);
    return 1;
  }
  if (use_json) {
    curl_mfprintf(stream,"\"%s\":null",wovar->name);
  }
  return 1;
}

Assistant:

static int writeTime(FILE *stream, const struct writeoutvar *wovar,
                     struct per_transfer *per, CURLcode per_result,
                     bool use_json)
{
  bool valid = false;
  curl_off_t us = 0;

  (void)per;
  (void)per_result;
  DEBUGASSERT(wovar->writefunc == writeTime);

  if(wovar->ci) {
    if(!curl_easy_getinfo(per->curl, wovar->ci, &us))
      valid = true;
  }
  else {
    DEBUGASSERT(0);
  }

  if(valid) {
    curl_off_t secs = us / 1000000;
    us %= 1000000;

    if(use_json)
      fprintf(stream, "\"%s\":", wovar->name);

    fprintf(stream, "%" CURL_FORMAT_CURL_OFF_TU
            ".%06" CURL_FORMAT_CURL_OFF_TU, secs, us);
  }
  else {
    if(use_json)
      fprintf(stream, "\"%s\":null", wovar->name);
  }

  return 1; /* return 1 if anything was written */
}